

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (void *param_1,undefined8 *param_2,long *param_3)

{
  ulong uVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  uint matches;
  int diff;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  uint7 in_stack_ffffffffffffffb0;
  bool bVar2;
  matcher_wrapper<boost::xpressive::detail::set_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::int_<2>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__i;
  uint local_28;
  bool local_1;
  
  local_28 = 0;
  __i = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)*param_2;
  while( true ) {
    bVar2 = false;
    if (local_28 <
        *(uint *)&((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_1)->sub_matches_) {
      bVar2 = matcher_wrapper<boost::xpressive::detail::set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>>
              ::match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (in_stack_ffffffffffffffc0,
                         (match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_1);
    }
    if (bVar2 == false) break;
    local_28 = local_28 + 1;
  }
  if (((ulong)(((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)param_1)->begin_)._M_current & 1) != 0) {
    if ((local_28 == 0) ||
       (*(uint *)&((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_1)->sub_matches_ <= local_28)) {
      in_stack_ffffffffffffffc8._M_current = (char *)__i;
      bVar2 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(ulong)in_stack_ffffffffffffffb0,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffffa8._M_current);
      __i = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffffc8._M_current;
      if (!bVar2) {
        in_stack_ffffffffffffffc8 =
             next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       (in_stack_ffffffffffffffa8);
      }
    }
    else {
      in_stack_ffffffffffffffc8._M_current = (char *)*param_2;
    }
    param_2[0x12] = in_stack_ffffffffffffffc8._M_current;
  }
  if (local_28 <
      *(uint *)((long)&(((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_1)->cur_)._M_current + 4)) {
    *param_2 = __i;
    local_1 = false;
  }
  else {
    while (uVar1 = (**(code **)(*param_3 + 0x10))(param_3,param_2), (uVar1 & 1) == 0) {
      if (*(uint *)((long)&(((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_1)->cur_)._M_current + 4) == local_28) {
        *param_2 = __i;
        return false;
      }
      local_28 = local_28 - 1;
      std::advance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int>
                (__i,(int)((ulong)in_stack_ffffffffffffffc8._M_current >> 0x20));
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }